

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O2

wchar_t ui_entry_search(char *name,int *ind)

{
  ui_entry **ppuVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  
  ppuVar1 = entries;
  wVar4 = n_entry;
  wVar6 = L'\0';
  do {
    wVar5 = wVar4;
    if (wVar6 == wVar5) {
      wVar4 = L'\0';
LAB_001d2c5a:
      *ind = wVar5;
      return wVar4;
    }
    wVar2 = (wVar5 + wVar6) / 2;
    iVar3 = strcmp(ppuVar1[wVar2]->name,name);
    if (iVar3 == 0) {
      wVar4 = L'\x01';
      wVar5 = wVar2;
      goto LAB_001d2c5a;
    }
    wVar4 = wVar2;
    if (iVar3 < 0) {
      wVar4 = wVar5;
      wVar6 = wVar2 + L'\x01';
    }
  } while( true );
}

Assistant:

static int ui_entry_search(const char *name, int *ind)
{
	/* They're sorted by name so use a binary search. */
	int ilow = 0, ihigh = n_entry;

	while (1) {
		int imid, cmp;

		if (ilow == ihigh) {
			*ind = ilow;
			return 0;
		}
		imid = (ilow + ihigh) / 2;
		cmp = strcmp(entries[imid]->name, name);
		if (cmp == 0) {
			*ind = imid;
			return 1;
		}
		if (cmp < 0) {
			ilow = imid + 1;
		} else {
			ihigh = imid;
		}
	}
}